

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatawidgetmapper.cpp
# Opt level: O2

void __thiscall QDataWidgetMapper::clearMapping(QDataWidgetMapper *this)

{
  long lVar1;
  pointer pWVar2;
  bool bVar3;
  pointer this_00;
  const_reverse_iterator end;
  long in_FS_OFFSET;
  vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
  local_38;
  long local_20;
  pointer pWVar4;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  pWVar2 = *(pointer *)(lVar1 + 0xa0);
  local_38.
  super__Vector_base<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
  ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)(lVar1 + 0xa8);
  local_38.
  super__Vector_base<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)(lVar1 + 0xb0);
  *(undefined8 *)(lVar1 + 0xa0) = 0;
  *(undefined8 *)(lVar1 + 0xa8) = 0;
  *(undefined8 *)(lVar1 + 0xb0) = 0;
  this_00 = local_38.
            super__Vector_base<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_38.
  super__Vector_base<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
  ._M_impl.super__Vector_impl_data._M_start = pWVar2;
  while (pWVar4 = this_00, this_00 = pWVar4 + -1, pWVar4 != pWVar2) {
    bVar3 = QPointer::operator_cast_to_bool((QPointer *)this_00);
    if (bVar3) {
      QObject::removeEventFilter(pWVar4[-1].widget.wp.value);
    }
  }
  std::
  vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
  ::~vector(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDataWidgetMapper::clearMapping()
{
    Q_D(QDataWidgetMapper);

    decltype(d->widgetMap) copy;
    d->widgetMap.swap(copy); // a C++98 move
    for (auto it = copy.crbegin(), end = copy.crend(); it != end; ++it) {
        if (it->widget)
            it->widget->removeEventFilter(d->delegate);
    }
}